

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::SomeObjectHelper<unsigned_int>
              (RecyclableObject *obj,uint length,uint start,RecyclableObject *callBackFn,Var thisArg
              ,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Var pvVar4;
  JavascriptMethod p_Var5;
  uint64 uVar6;
  uint64 uVar7;
  bool bVar8;
  uint32 index;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double value;
  JavascriptBoolean *local_88;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,obj);
  bVar11 = start < length;
  if (bVar11) {
    jsReentLock._24_8_ = __tls_get_addr(&PTR_0155fe48);
    uVar9 = (ulong)start;
    do {
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      index = (uint32)uVar9;
      BVar3 = JavascriptOperators::HasItem(obj,index);
      JsReentLock::MutateArrayObject((JsReentLock *)local_80);
      *(bool *)((long)local_80 + 0x108) = true;
      bVar8 = true;
      if (BVar3 != 0) {
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar4 = JavascriptOperators::GetItem(obj,index,scriptContext);
        this = scriptContext->threadContext;
        bVar8 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var5);
        p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
        if ((int)index < 0) {
          value = (double)(uVar9 & 0xffffffff);
          uVar6 = NumberUtilities::ToSpecial(value);
          bVar2 = NumberUtilities::IsNan(value);
          if (((bVar2) && (uVar7 = NumberUtilities::ToSpecial(value), uVar7 != 0xfff8000000000000))
             && (uVar7 = NumberUtilities::ToSpecial(value), uVar7 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)jsReentLock._24_8_ = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)jsReentLock._24_8_ = 0;
          }
          uVar10 = uVar6 ^ 0xfffc000000000000;
        }
        else {
          uVar10 = uVar9 + 0x1000000000000;
        }
        pvVar4 = (*p_Var5)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,
                           pvVar4,uVar10,obj);
        this->reentrancySafeOrHandled = bVar8;
        BVar3 = JavascriptConversion::ToBoolean(pvVar4,scriptContext);
        bVar8 = true;
        if (BVar3 != 0) {
          local_88 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).booleanTrue.ptr;
          bVar8 = false;
        }
      }
      if (!bVar8) break;
      uVar9 = uVar9 + 1;
      bVar11 = uVar9 < length;
    } while (uVar9 != length);
  }
  if (!bVar11) {
    local_88 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).booleanFalse.ptr;
  }
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_88;
}

Assistant:

Var JavascriptArray::SomeObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT_UNLOCK(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }

        return scriptContext->GetLibrary()->GetFalse();
    }